

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O1

void __thiscall
QAbstractItemModelTesterPrivate::columnsRemoved
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int first,int last)

{
  QObject *pQVar1;
  QDebug QVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QArrayData *local_b8;
  undefined8 *local_b0;
  ChangeInFlight local_a0 [6];
  char *local_88;
  QDebug local_80;
  undefined1 local_78 [8];
  QDebug local_70;
  QString local_68;
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0[0] = ColumnsRemoved;
  bVar3 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,local_a0,"changeInFlight",
                     "ChangeInFlight::ColumnsRemoved",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,800);
  if (bVar3) {
    this->changeInFlight = None;
    lcModelTest();
    if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_a0[0] = ColumnsMoved;
      local_a0[1] = None;
      local_a0[2] = None;
      local_a0[3] = None;
      local_a0[4] = None;
      local_a0[5] = 0;
      local_88 = lcModelTest::category.name;
      QMessageLogger::debug();
      QVar2.stream = local_80.stream;
      QVar5.m_data = (storage_type *)0xe;
      QVar5.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar5);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)&local_50);
      if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50.shared = *(int *)local_50.shared + -1;
        UNLOCK();
        if (*(int *)local_50.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      QVar2.stream = local_80.stream;
      QVar6.m_data = (storage_type *)0x6;
      QVar6.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar6);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)&local_50);
      if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50.shared = *(int *)local_50.shared + -1;
        UNLOCK();
        if (*(int *)local_50.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_80.stream,first);
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      QVar2.stream = local_80.stream;
      QVar7.m_data = (storage_type *)0x4;
      QVar7.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)&local_50);
      if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50.shared = *(int *)local_50.shared + -1;
        UNLOCK();
        if (*(int *)local_50.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_80.stream,last);
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      QVar2.stream = local_80.stream;
      QVar8.m_data = (storage_type *)0x7;
      QVar8.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)&local_50);
      if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50.shared = *(int *)local_50.shared + -1;
        UNLOCK();
        if (*(int *)local_50.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_80.stream,' ');
      }
      local_78 = (undefined1  [8])local_80.stream;
      *(int *)(local_80.stream + 0x28) = *(int *)(local_80.stream + 0x28) + 1;
      operator<<((Stream *)(local_78 + 8),(QModelIndex *)local_78);
      QVar2.stream = local_70.stream;
      QVar9.m_data = (storage_type *)0xc;
      QVar9.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)&local_50);
      if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50.shared = *(int *)local_50.shared + -1;
        UNLOCK();
        if (*(int *)local_50.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
        }
      }
      if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_70.stream,' ');
      }
      pQVar1 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_50,pQVar1,parent,0);
      QVariant::toString();
      if (local_b0 == (undefined8 *)0x0) {
        local_b0 = &QString::_empty;
      }
      QDebug::putString((QChar *)(local_78 + 8),(ulong)local_b0);
      if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_70.stream,' ');
      }
      QVar2.stream = local_70.stream;
      QVar10.m_data = (storage_type *)0x18;
      QVar10.m_size = (qsizetype)(local_78 + 0x10);
      QString::fromUtf8(QVar10);
      QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)(local_78 + 0x10));
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_68.d.d = *(int *)local_68.d.d + -1;
        UNLOCK();
        if (*(int *)local_68.d.d == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_70.stream,' ');
      }
      pQVar1 = (this->model).wp.value;
      iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
      QTextStream::operator<<((QTextStream *)local_70.stream,iVar4);
      if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_70.stream,' ');
      }
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b8,2,0x10);
        }
      }
      QVariant::~QVariant((QVariant *)&local_50);
      QDebug::~QDebug((QDebug *)(local_78 + 8));
      QDebug::~QDebug((QDebug *)local_78);
      QDebug::~QDebug(&local_80);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::columnsRemoved(const QModelIndex &parent, int first, int last)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::ColumnsRemoved);
    changeInFlight = ChangeInFlight::None;

    qCDebug(lcModelTest) << "columnsRemoved"
                         << "start=" << first << "end=" << last << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent);
}